

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFunctionPosition::Get_p_dsds
          (ChVector<double> *__return_storage_ptr__,ChFunctionPosition *this,double s)

{
  ChVector<double> *v;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  (*this->_vptr_ChFunctionPosition[4])(s + 1e-07,&local_38);
  (*this->_vptr_ChFunctionPosition[4])(s,&local_50,this);
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[0] = (local_38 - local_50) * 10000000.0;
  __return_storage_ptr__->m_data[1] = (local_30 - local_48) * 10000000.0;
  __return_storage_ptr__->m_data[2] = (local_28 - local_40) * 10000000.0;
  return __return_storage_ptr__;
}

Assistant:

virtual ChVector<> Get_p_dsds(double s) const { return ((Get_p_ds(s + BDF_STEP_LOW) - Get_p_ds(s)) / BDF_STEP_LOW); }